

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

string * __thiscall
cmCTestCVS::ComputeBranchFlag(string *__return_storage_ptr__,cmCTestCVS *this,string *dir)

{
  bool bVar1;
  string tagFile;
  string tagLine;
  cmAlphaNum local_288;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  cmAlphaNum local_248;
  ifstream tagStream;
  byte abStack_1f8 [488];
  
  std::__cxx11::string::string
            ((string *)&tagFile,(string *)&(this->super_cmCTestVC).SourceDirectory);
  if (dir->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&tagFile);
    std::__cxx11::string::append((string *)&tagFile);
  }
  std::__cxx11::string::append((char *)&tagFile);
  tagLine._M_dataplus._M_p = (pointer)&tagLine.field_2;
  tagLine._M_string_length = 0;
  tagLine.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&tagStream,tagFile._M_dataplus._M_p,_S_in);
  if ((abStack_1f8[*(long *)(_tagStream + -0x18)] & 5) == 0) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&tagStream,&tagLine,(bool *)0x0,0xffffffffffffffff);
    if (((bVar1) && (1 < tagLine._M_string_length)) && (*tagLine._M_dataplus._M_p == 'T')) {
      local_288.View_._M_len = 2;
      local_288.View_._M_str = "-r";
      local_258._M_len = tagLine._M_string_length;
      local_258._M_str = tagLine._M_dataplus._M_p;
      local_248.View_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_258,1,0xffffffffffffffff);
      cmStrCat<>(__return_storage_ptr__,&local_288,&local_248);
      goto LAB_004998ea;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"-b",(allocator<char> *)&local_288);
LAB_004998ea:
  std::ifstream::~ifstream(&tagStream);
  std::__cxx11::string::~string((string *)&tagLine);
  std::__cxx11::string::~string((string *)&tagFile);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCVS::ComputeBranchFlag(std::string const& dir)
{
  // Compute the tag file location for this directory.
  std::string tagFile = this->SourceDirectory;
  if (!dir.empty()) {
    tagFile += "/";
    tagFile += dir;
  }
  tagFile += "/CVS/Tag";

  // Lookup the branch in the tag file, if any.
  std::string tagLine;
  cmsys::ifstream tagStream(tagFile.c_str());
  if (tagStream && cmSystemTools::GetLineFromStream(tagStream, tagLine) &&
      tagLine.size() > 1 && tagLine[0] == 'T') {
    // Use the branch specified in the tag file.
    std::string flag = cmStrCat("-r", cm::string_view(tagLine).substr(1));
    return flag;
  }
  // Use the default branch.
  return "-b";
}